

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableSetColumnWidth(ImGuiTable *table,ImGuiTableColumn *column_0,float column_0_width)

{
  float fVar1;
  long in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float column_1_width_1;
  float column_1_width_2;
  float off;
  float column_1_width;
  ImGuiTableColumn *column_1;
  float max_width_0;
  float min_width;
  ImGuiTableColumn *local_40;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  float mx;
  float local_14;
  
  fVar2 = TableGetMinColumnWidth();
  mx = 3.4028235e+38;
  if ((*(uint *)(in_RDI + 4) & 0x100000) == 0) {
    mx = -(float)(*(int *)(in_RDI + 0x70) - (*(char *)(in_RSI + 0x5b) + 1)) * fVar2 +
         (*(float *)(in_RDI + 0xfc) - *(float *)(in_RSI + 0x1c));
  }
  local_14 = ImClamp<float>(in_XMM0_Da,fVar2,mx);
  if (((*(float *)(in_RSI + 0x30) != local_14) || (NAN(*(float *)(in_RSI + 0x30)) || NAN(local_14)))
     && ((*(float *)(in_RSI + 0x2c) != local_14 || (NAN(*(float *)(in_RSI + 0x2c)) || NAN(local_14))
         ))) {
    if (*(char *)(in_RSI + 0x60) == -1) {
      local_40 = (ImGuiTableColumn *)0x0;
    }
    else {
      local_40 = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc);
    }
    *(undefined1 *)(in_RDI + 0x1da) = 1;
    if ((*(uint *)(in_RSI + 0x18) & 4) == 0) {
      if ((*(uint *)(in_RSI + 0x18) & 8) != 0) {
        if ((local_40 == (ImGuiTableColumn *)0x0) || ((local_40->Flags & 4U) == 0)) {
          fVar3 = ImMax<float>(local_40->WidthRequest - (local_14 - *(float *)(in_RSI + 0x2c)),fVar2
                              );
          fVar2 = *(float *)(in_RSI + 0x2c);
          fVar1 = local_40->WidthRequest;
          local_40->WidthRequest = fVar3;
          *(float *)(in_RSI + 0x2c) = (fVar2 + fVar1) - fVar3;
          TableUpdateColumnsWeightFromWidth((ImGuiTable *)CONCAT44(mx,in_stack_ffffffffffffffe0));
        }
        else {
          fVar2 = ImMax<float>(fVar2,local_40->WidthGiven + (*(float *)(in_RSI + 0x30) - local_14));
          local_40->WidthRequest = fVar2;
        }
      }
    }
    else {
      if ((((local_40 != (ImGuiTableColumn *)0x0) && ((local_40->Flags & 4U) != 0)) &&
          (*(char *)(in_RDI + 0x1ca) != -1)) &&
         (*(char *)(in_RDI + 0x1ca) < *(char *)(in_RSI + 0x5a))) {
        fVar2 = ImMax<float>(local_40->WidthRequest - (local_14 - *(float *)(in_RSI + 0x2c)),fVar2);
        local_14 = (*(float *)(in_RSI + 0x2c) + local_40->WidthRequest) - fVar2;
        local_40->WidthRequest = fVar2;
      }
      *(float *)(in_RSI + 0x2c) = local_14;
    }
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidth(ImGuiTable* table, ImGuiTableColumn* column_0, float column_0_width)
{
    // Constraints
    float min_width = TableGetMinColumnWidth();
    float max_width_0 = FLT_MAX;
    if (!(table->Flags & ImGuiTableFlags_ScrollX))
        max_width_0 = (table->WorkRect.Max.x - column_0->MinX) - (table->ColumnsVisibleCount - (column_0->IndexWithinVisibleSet + 1)) * min_width;
    column_0_width = ImClamp(column_0_width, min_width, max_width_0);

    // Compare both requested and actual given width to avoid overwriting requested width when column is stuck (minimum size, bounded)
    if (column_0->WidthGiven == column_0_width || column_0->WidthRequest == column_0_width)
        return;

    ImGuiTableColumn* column_1 = (column_0->NextVisibleColumn != -1) ? &table->Columns[column_0->NextVisibleColumn] : NULL;

    // In this surprisingly not simple because of how we support mixing Fixed and Stretch columns.
    // When forwarding resize from Wn| to Fn+1| we need to be considerate of the _NoResize flag on Fn+1.
    // FIXME-TABLE: Find a way to rewrite all of this so interactions feel more consistent for the user.
    // Scenarios:
    // - F1 F2 F3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. Subsequent columns will be offset.
    // - F1 F2 F3  resize from F3|          --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered.
    // - F1 F2 W3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered, but it doesn't make much sense as the Stretch column will always be minimal size.
    // - F1 F2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 W3  resize from W1| or W2|   --> FIXME
    // - W1 W2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2 F3  resize from F3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2     resize from F2|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 F3  resize from W1| or W2|   --> ok
    // - W1 F2 W3  resize from W1| or F2|   --> FIXME
    // - F1 W2 F3  resize from W2|          --> ok
    // - W1 F2 F3  resize from W1|          --> ok: equivalent to resizing |F2. F3 will not move. (forwarded by Resize Rule 2)
    // - W1 F2 F3  resize from F2|          --> FIXME should resize F2, F3 and not have effect on W1 (Stretch columns are _before_ the Fixed column).

    // Rules:
    // - [Resize Rule 1] Can't resize from right of right-most visible column if there is any Stretch column. Implemented in TableUpdateLayout().
    // - [Resize Rule 2] Resizing from right-side of a Stretch column before a fixed column forward sizing to left-side of fixed column.
    // - [Resize Rule 3] If we are are followed by a fixed column and we have a Stretch column before, we need to ensure that our left border won't move.
    table->IsSettingsDirty = true;
    if (column_0->Flags & ImGuiTableColumnFlags_WidthFixed)
    {
        // [Resize Rule 3] If we are are followed by a fixed column and we have a Stretch column before, we need to ensure
        // that our left border won't move, which we can do by making sure column_a/column_b resizes cancels each others.
        if (column_1 && (column_1->Flags & ImGuiTableColumnFlags_WidthFixed))
            if (table->LeftMostStretchedColumnDisplayOrder != -1 && table->LeftMostStretchedColumnDisplayOrder < column_0->DisplayOrder)
            {
                // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
                float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
                column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
                column_1->WidthRequest = column_1_width;
            }

        // Apply
        //IMGUI_DEBUG_LOG("TableSetColumnWidth(%d, %.1f->%.1f)\n", column_0_idx, column_0->WidthRequested, column_0_width);
        column_0->WidthRequest = column_0_width;
    }
    else if (column_0->Flags & ImGuiTableColumnFlags_WidthStretch)
    {
        // [Resize Rule 2]
        if (column_1 && (column_1->Flags & ImGuiTableColumnFlags_WidthFixed))
        {
            float off = (column_0->WidthGiven - column_0_width);
            float column_1_width = column_1->WidthGiven + off;
            column_1->WidthRequest = ImMax(min_width, column_1_width);
            return;
        }

        // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
        float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
        column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
        column_1->WidthRequest = column_1_width;
        column_0->WidthRequest = column_0_width;
        TableUpdateColumnsWeightFromWidth(table);
    }
}